

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::each_max_with<signed_char>(Omega_h *this,Read<signed_char> *a,char b)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> local_d8;
  undefined1 local_c8 [8];
  type f;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  Write<signed_char> c;
  char b_local;
  Read<signed_char> *a_local;
  LO local_20;
  LO local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (LO)((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (LO)((ulong)(a->write_).shared_alloc_.alloc >> 3);
  }
  c.shared_alloc_.direct_ptr._7_1_ = b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"",&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_68,local_10,(string *)local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  Write<signed_char>::Write((Write<signed_char> *)local_c8,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)&f.c.shared_alloc_.direct_ptr,a);
  f.a.write_.shared_alloc_.direct_ptr._0_1_ = c.shared_alloc_.direct_ptr._7_1_;
  if (((ulong)local_68 & 1) == 0) {
    local_20 = (LO)*(size_t *)local_68;
  }
  else {
    local_20 = (LO)((ulong)local_68 >> 3);
  }
  parallel_for<Omega_h::each_max_with<signed_char>(Omega_h::Read<signed_char>,signed_char)::_lambda(int)_1_>
            (local_20,(type *)local_c8,"each_max_with");
  Write<signed_char>::Write(&local_d8,(Write<signed_char> *)local_68);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_d8);
  Write<signed_char>::~Write(&local_d8);
  each_max_with<signed_char>(Omega_h::Read<signed_char>,signed_char)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)local_c8);
  Write<signed_char>::~Write((Write<signed_char> *)local_68);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> each_max_with(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = max2(a[i], b); };
  parallel_for(c.size(), f, "each_max_with");
  return c;
}